

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  u64 n_00;
  bool bVar4;
  
  n_00 = 0x20;
  if (0x20 < n) {
    n_00 = (u64)(uint)n;
  }
  bVar4 = bPreserve == 0;
  if (bVar4) {
    if (0 < pMem->szMalloc) goto LAB_0012e637;
  }
  else if (0 < pMem->szMalloc) {
    if (pMem->z == pMem->zMalloc) {
      pcVar3 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,n_00);
      pMem->zMalloc = pcVar3;
      pMem->z = pcVar3;
      bVar4 = true;
      goto LAB_0012e654;
    }
LAB_0012e637:
    sqlite3DbFreeNN(pMem->db,pMem->zMalloc);
  }
  pcVar3 = (char *)sqlite3DbMallocRaw(pMem->db,n_00);
  pMem->zMalloc = pcVar3;
LAB_0012e654:
  if (pcVar3 == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    iVar2 = 7;
  }
  else {
    iVar2 = sqlite3DbMallocSize(pMem->db,pcVar3);
    pMem->szMalloc = iVar2;
    if (((!bVar4) && (pcVar3 = pMem->z, pcVar3 != (char *)0x0)) && (pcVar3 != pMem->zMalloc)) {
      memcpy(pMem->zMalloc,pcVar3,(long)pMem->n);
    }
    uVar1._0_2_ = pMem->flags;
    uVar1._2_1_ = pMem->enc;
    uVar1._3_1_ = pMem->eSubtype;
    if ((uVar1 >> 10 & 1) != 0) {
      (*pMem->xDel)(pMem->z);
      uVar1._0_2_ = pMem->flags;
    }
    pMem->z = pMem->zMalloc;
    pMem->flags = (ushort)uVar1 & 0xe3ff;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db, pMem->zMalloc) );
  if( n<32 ) n = 32;
  if( bPreserve && pMem->szMalloc>0 && pMem->z==pMem->zMalloc ){
    pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z && ALWAYS(pMem->z!=pMem->zMalloc) ){
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}